

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall Parse::Object::setPosition(Object *this,string *anchor,string *coordN)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  Position *pPVar4;
  
  if (this->position == (Position *)0x0) {
    pPVar4 = (Position *)operator_new(0x40);
    (pPVar4->y)._M_dataplus._M_p = (pointer)0x0;
    (pPVar4->y)._M_string_length = 0;
    (pPVar4->y).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pPVar4->y).field_2 + 8) = 0;
    (pPVar4->x).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pPVar4->x).field_2 + 8) = 0;
    (pPVar4->x)._M_dataplus._M_p = (pointer)&(pPVar4->x).field_2;
    (pPVar4->x)._M_string_length = 0;
    (pPVar4->y)._M_dataplus._M_p = (pointer)&(pPVar4->y).field_2;
    (pPVar4->y).field_2._M_local_buf[0] = '\0';
    this->position = pPVar4;
  }
  iVar3 = std::__cxx11::string::compare((char *)anchor);
  if (iVar3 == 0) {
    pcVar1 = (coordN->_M_dataplus)._M_p;
    pPVar4 = this->position;
    pcVar2 = (char *)(pPVar4->x)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)pPVar4,0,pcVar2,(ulong)pcVar1);
  }
  iVar3 = std::__cxx11::string::compare((char *)anchor);
  if (iVar3 != 0) {
    return;
  }
  pcVar1 = (coordN->_M_dataplus)._M_p;
  pPVar4 = this->position;
  pcVar2 = (char *)(pPVar4->x)._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)pPVar4,0,pcVar2,(ulong)pcVar1);
  return;
}

Assistant:

void setPosition(std::string anchor, std::string coordN) {
                if (position == NULL) {
                    position = new Position();
                }
                if (anchor == "x") {
                    position->x = (coordN.c_str());
                }
                if (anchor == "y") {
                    position->x = (coordN.c_str());
                }
            }